

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O1

REF_STATUS ref_mpi_start(int argc,char **argv)

{
  undefined1 local_c [4];
  undefined1 local_8 [8];
  
  MPI_Init(local_c,local_8);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_start(int argc, char *argv[]) {
#ifdef HAVE_MPI
  MPI_Init(&argc, &argv);
#else
  SUPRESS_UNUSED_COMPILER_WARNING(argc);
  SUPRESS_UNUSED_COMPILER_WARNING(argv);
#endif
#ifdef HAVE_KOKKOS
  Kokkos::initialize();
#endif

  return REF_SUCCESS;
}